

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::~TPZSkylMatrix
          (TPZSkylMatrix<std::complex<long_double>_> *this)

{
  ~TPZSkylMatrix(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

virtual ~TPZSkylMatrix() { Clear(); }